

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_warc.c
# Opt level: O0

void xstrftime(archive_string *as,char *fmt,time_t t)

{
  tm *__tp;
  size_t n;
  size_t len;
  char strtime [100];
  tm timeHere;
  tm *rt;
  time_t t_local;
  char *fmt_local;
  archive_string *as_local;
  
  rt = (tm *)t;
  t_local = (time_t)fmt;
  fmt_local = (char *)as;
  __tp = gmtime_r((time_t *)&rt,(tm *)(strtime + 0x60));
  if (__tp != (tm *)0x0) {
    n = strftime((char *)&len,99,(char *)t_local,__tp);
    archive_strncat((archive_string *)fmt_local,&len,n);
  }
  return;
}

Assistant:

static void
xstrftime(struct archive_string *as, const char *fmt, time_t t)
{
/** like strftime(3) but for time_t objects */
	struct tm *rt;
#if defined(HAVE_GMTIME_R) || defined(HAVE_GMTIME_S)
	struct tm timeHere;
#endif
	char strtime[100];
	size_t len;

#if defined(HAVE_GMTIME_S)
	rt = gmtime_s(&timeHere, &t) ? NULL : &timeHere;
#elif defined(HAVE_GMTIME_R)
	rt = gmtime_r(&t, &timeHere);
#else
	rt = gmtime(&t);
#endif
	if (!rt)
		return;
	/* leave the hard yacker to our role model strftime() */
	len = strftime(strtime, sizeof(strtime)-1, fmt, rt);
	archive_strncat(as, strtime, len);
}